

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O3

void __thiscall
lsim::LSimContext::load_reference_library(LSimContext *this,char *name,char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ModelCircuitLibrary *pMVar2;
  bool bVar3;
  iterator iVar4;
  ModelCircuitLibrary *pMVar5;
  default_delete<lsim::ModelCircuitLibrary> *this_00;
  ModelCircuitLibrary *local_80;
  allocator local_71;
  key_type local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_50);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_reference_libraries)._M_h,&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pMVar5 = (ModelCircuitLibrary *)operator_new(200);
    ModelCircuitLibrary::ModelCircuitLibrary(pMVar5,name,filename);
    local_80 = pMVar5;
    std::__cxx11::string::string((string *)&local_50,filename,&local_71);
    full_file_path(&local_70,this,&local_50);
    bVar3 = deserialize_library(this,pMVar5,local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pMVar5 = local_80;
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_50);
      this_00 = (default_delete<lsim::ModelCircuitLibrary> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_reference_libraries,&local_70);
      pMVar2 = local_80;
      local_80 = (ModelCircuitLibrary *)0x0;
      pMVar5 = *(ModelCircuitLibrary **)this_00;
      *(ModelCircuitLibrary **)this_00 = pMVar2;
      if (pMVar5 != (ModelCircuitLibrary *)0x0) {
        std::default_delete<lsim::ModelCircuitLibrary>::operator()(this_00,pMVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_80 = (ModelCircuitLibrary *)0x0;
      if (pMVar5 == (ModelCircuitLibrary *)0x0) {
        return;
      }
      std::default_delete<lsim::ModelCircuitLibrary>::operator()
                ((default_delete<lsim::ModelCircuitLibrary> *)&local_80,pMVar5);
    }
    if (local_80 != (ModelCircuitLibrary *)0x0) {
      std::default_delete<lsim::ModelCircuitLibrary>::operator()
                ((default_delete<lsim::ModelCircuitLibrary> *)&local_80,local_80);
    }
  }
  return;
}

Assistant:

void LSimContext::load_reference_library(const char *name, const char *filename) {
    if (m_reference_libraries.find(name) != m_reference_libraries.end()) {
        return;
    }

    auto lib = std::make_unique<ModelCircuitLibrary>(name, filename);
    if (!deserialize_library(this, lib.get(), full_file_path(filename).c_str())) {
        lib = nullptr;
        return;
    }

    m_reference_libraries[name] = std::move(lib);
}